

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Compilation.cpp
# Opt level: O3

pair<slang::ast::Compilation::DefinitionLookupResult,_bool> * __thiscall
slang::ast::Compilation::resolveConfigRule
          (pair<slang::ast::Compilation::DefinitionLookupResult,_bool> *__return_storage_ptr__,
          Compilation *this,Scope *scope,ConfigRule *rule)

{
  string_view *sv;
  group_type_pointer pgVar1;
  value_type_pointer __y;
  group_type_pointer pgVar2;
  size_t sVar3;
  group_type_pointer pgVar4;
  value_type_pointer ppVar5;
  RootSymbol *pRVar6;
  group_type_pointer pgVar7;
  value_type_pointer ppVar8;
  ulong uVar9;
  pointer ppCVar10;
  ConfigBlockSymbol *this_00;
  pointer pTVar11;
  ConfigRule *pCVar12;
  pointer ppSVar13;
  Symbol *this_01;
  uint uVar14;
  undefined1 auVar15 [16];
  uchar uVar16;
  uchar uVar17;
  uchar uVar18;
  byte bVar19;
  bool bVar20;
  byte bVar21;
  uint uVar22;
  DefinitionSymbol *pDVar23;
  uint64_t uVar24;
  SourceLibrary *pSVar25;
  SourceLibrary *pSVar26;
  Diagnostic *pDVar27;
  pointer ppCVar28;
  pointer ppSVar29;
  value_type_pointer __u;
  ulong uVar30;
  ulong uVar31;
  long lVar32;
  ulong uVar33;
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  SourceRange SVar36;
  string_view name;
  size_t seed;
  size_t local_50;
  tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*> local_48;
  
  rule->isUsed = true;
  sVar3 = (rule->useCell).lib._M_len;
  if (sVar3 == 0) {
    pSVar25 = this->defaultLibPtr;
    pDVar23 = Symbol::getDeclaringDefinition(scope->thisSym);
    if (pDVar23 != (DefinitionSymbol *)0x0) {
      pSVar25 = pDVar23->sourceLibrary;
    }
  }
  else {
    name._M_str = (rule->useCell).lib._M_str;
    name._M_len = sVar3;
    pSVar25 = getSourceLibrary(this,name);
    if (pSVar25 == (SourceLibrary *)0x0) {
      pDVar27 = Scope::addDiag(&((this->root)._M_t.
                                 super___uniq_ptr_impl<slang::ast::RootSymbol,_std::default_delete<slang::ast::RootSymbol>_>
                                 ._M_t.
                                 super__Tuple_impl<0UL,_slang::ast::RootSymbol_*,_std::default_delete<slang::ast::RootSymbol>_>
                                 .super__Head_base<0UL,_slang::ast::RootSymbol_*,_false>.
                                _M_head_impl)->super_Scope,(DiagCode)0x20000d,
                               (rule->useCell).sourceRange);
      Diagnostic::operator<<(pDVar27,(rule->useCell).lib);
LAB_002e78a5:
      (__return_storage_ptr__->first).definition = (Symbol *)0x0;
      (__return_storage_ptr__->first).configRoot = (ConfigBlockSymbol *)0x0;
      (__return_storage_ptr__->first).configRule = (ConfigRule *)0x0;
      goto LAB_002e7b00;
    }
  }
  if ((rule->useCell).targetConfig == false) {
    pRVar6 = (this->root)._M_t.
             super___uniq_ptr_impl<slang::ast::RootSymbol,_std::default_delete<slang::ast::RootSymbol>_>
             ._M_t.
             super__Tuple_impl<0UL,_slang::ast::RootSymbol_*,_std::default_delete<slang::ast::RootSymbol>_>
             .super__Head_base<0UL,_slang::ast::RootSymbol_*,_false>._M_head_impl;
    local_48.
    super__Tuple_impl<0UL,_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>
    .super__Tuple_impl<1UL,_const_slang::ast::Scope_*>.
    super__Head_base<1UL,_const_slang::ast::Scope_*,_false>._M_head_impl =
         (_Head_base<1UL,_const_slang::ast::Scope_*,_false>)&pRVar6->super_Scope;
    if (pRVar6 == (RootSymbol *)0x0) {
      local_48.
      super__Tuple_impl<0UL,_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>
      .super__Tuple_impl<1UL,_const_slang::ast::Scope_*>.
      super__Head_base<1UL,_const_slang::ast::Scope_*,_false>._M_head_impl =
           (_Head_base<1UL,_const_slang::ast::Scope_*,_false>)(Scope *)0x0;
    }
    local_48.
    super__Tuple_impl<0UL,_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>
    .super__Head_base<0UL,_std::basic_string_view<char,_std::char_traits<char>_>,_false>.
    _M_head_impl._M_len = (rule->useCell).name._M_len;
    local_48.
    super__Tuple_impl<0UL,_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>
    .super__Head_base<0UL,_std::basic_string_view<char,_std::char_traits<char>_>,_false>.
    _M_head_impl._M_str = (rule->useCell).name._M_str;
    local_50 = 0;
    slang::detail::hashing::
    HashValueImpl<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_1UL>
    ::apply(&local_50,&local_48);
    auVar15._8_8_ = 0;
    auVar15._0_8_ = local_50;
    uVar33 = SUB168(ZEXT816(0x9e3779b97f4a7c15) * auVar15,8) ^
             SUB168(ZEXT816(0x9e3779b97f4a7c15) * auVar15,0);
    uVar30 = uVar33 >> ((byte)(this->definitionMap).table_.
                              super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::tuple<std::basic_string_view<char>,_const_slang::ast::Scope_*>,_std::pair<std::vector<slang::ast::Symbol_*>,_bool>_>,_slang::hash<std::tuple<std::basic_string_view<char>,_const_slang::ast::Scope_*>_>,_std::equal_to<std::tuple<std::basic_string_view<char>,_const_slang::ast::Scope_*>_>,_std::allocator<std::pair<const_std::tuple<std::basic_string_view<char>,_const_slang::ast::Scope_*>,_std::pair<std::vector<slang::ast::Symbol_*>,_bool>_>_>_>
                              .arrays.groups_size_index & 0x3f);
    lVar32 = (uVar33 & 0xff) * 4;
    uVar16 = (&UNK_004a938c)[lVar32];
    uVar17 = (&UNK_004a938d)[lVar32];
    uVar18 = (&UNK_004a938e)[lVar32];
    bVar19 = (&UNK_004a938f)[lVar32];
    uVar31 = 0;
    do {
      pgVar7 = (this->definitionMap).table_.
               super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::tuple<std::basic_string_view<char>,_const_slang::ast::Scope_*>,_std::pair<std::vector<slang::ast::Symbol_*>,_bool>_>,_slang::hash<std::tuple<std::basic_string_view<char>,_const_slang::ast::Scope_*>_>,_std::equal_to<std::tuple<std::basic_string_view<char>,_const_slang::ast::Scope_*>_>,_std::allocator<std::pair<const_std::tuple<std::basic_string_view<char>,_const_slang::ast::Scope_*>,_std::pair<std::vector<slang::ast::Symbol_*>,_bool>_>_>_>
               .arrays.groups_;
      pgVar2 = pgVar7 + uVar30;
      bVar21 = pgVar2->m[0xf].n;
      auVar35[0] = -(pgVar2->m[0].n == uVar16);
      auVar35[1] = -(pgVar2->m[1].n == uVar17);
      auVar35[2] = -(pgVar2->m[2].n == uVar18);
      auVar35[3] = -(pgVar2->m[3].n == bVar19);
      auVar35[4] = -(pgVar2->m[4].n == uVar16);
      auVar35[5] = -(pgVar2->m[5].n == uVar17);
      auVar35[6] = -(pgVar2->m[6].n == uVar18);
      auVar35[7] = -(pgVar2->m[7].n == bVar19);
      auVar35[8] = -(pgVar2->m[8].n == uVar16);
      auVar35[9] = -(pgVar2->m[9].n == uVar17);
      auVar35[10] = -(pgVar2->m[10].n == uVar18);
      auVar35[0xb] = -(pgVar2->m[0xb].n == bVar19);
      auVar35[0xc] = -(pgVar2->m[0xc].n == uVar16);
      auVar35[0xd] = -(pgVar2->m[0xd].n == uVar17);
      auVar35[0xe] = -(pgVar2->m[0xe].n == uVar18);
      auVar35[0xf] = -(bVar21 == bVar19);
      uVar22 = (uint)(ushort)((ushort)(SUB161(auVar35 >> 7,0) & 1) |
                              (ushort)(SUB161(auVar35 >> 0xf,0) & 1) << 1 |
                              (ushort)(SUB161(auVar35 >> 0x17,0) & 1) << 2 |
                              (ushort)(SUB161(auVar35 >> 0x1f,0) & 1) << 3 |
                              (ushort)(SUB161(auVar35 >> 0x27,0) & 1) << 4 |
                              (ushort)(SUB161(auVar35 >> 0x2f,0) & 1) << 5 |
                              (ushort)(SUB161(auVar35 >> 0x37,0) & 1) << 6 |
                              (ushort)(SUB161(auVar35 >> 0x3f,0) & 1) << 7 |
                              (ushort)(SUB161(auVar35 >> 0x47,0) & 1) << 8 |
                              (ushort)(SUB161(auVar35 >> 0x4f,0) & 1) << 9 |
                              (ushort)(SUB161(auVar35 >> 0x57,0) & 1) << 10 |
                              (ushort)(SUB161(auVar35 >> 0x5f,0) & 1) << 0xb |
                              (ushort)(SUB161(auVar35 >> 0x67,0) & 1) << 0xc |
                              (ushort)(SUB161(auVar35 >> 0x6f,0) & 1) << 0xd |
                             (ushort)(SUB161(auVar35 >> 0x77,0) & 1) << 0xe);
      if (uVar22 != 0) {
        ppVar8 = (this->definitionMap).table_.
                 super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::tuple<std::basic_string_view<char>,_const_slang::ast::Scope_*>,_std::pair<std::vector<slang::ast::Symbol_*>,_bool>_>,_slang::hash<std::tuple<std::basic_string_view<char>,_const_slang::ast::Scope_*>_>,_std::equal_to<std::tuple<std::basic_string_view<char>,_const_slang::ast::Scope_*>_>,_std::allocator<std::pair<const_std::tuple<std::basic_string_view<char>,_const_slang::ast::Scope_*>,_std::pair<std::vector<slang::ast::Symbol_*>,_bool>_>_>_>
                 .arrays.elements_;
        do {
          uVar14 = 0;
          if (uVar22 != 0) {
            for (; (uVar22 >> uVar14 & 1) == 0; uVar14 = uVar14 + 1) {
            }
          }
          __u = ppVar8 + uVar30 * 0xf + (ulong)uVar14;
          bVar20 = std::
                   __tuple_compare<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_0UL,_2UL>
                   ::__eq(&local_48,&__u->first);
          if (bVar20) {
            ppSVar29 = (__u->second).first.
                       super__Vector_base<slang::ast::Symbol_*,_std::allocator<slang::ast::Symbol_*>_>
                       ._M_impl.super__Vector_impl_data._M_start;
            ppSVar13 = (__u->second).first.
                       super__Vector_base<slang::ast::Symbol_*,_std::allocator<slang::ast::Symbol_*>_>
                       ._M_impl.super__Vector_impl_data._M_finish;
            if (ppSVar29 == ppSVar13) goto LAB_002e770a;
            goto LAB_002e7ace;
          }
          uVar22 = uVar22 - 1 & uVar22;
        } while (uVar22 != 0);
        bVar21 = pgVar7[uVar30].m[0xf].n;
      }
      if (((&boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>::
             is_not_overflowed(unsigned_long)::shift)[(uint)uVar33 & 7] & bVar21) == 0) break;
      uVar9 = (this->definitionMap).table_.
              super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::tuple<std::basic_string_view<char>,_const_slang::ast::Scope_*>,_std::pair<std::vector<slang::ast::Symbol_*>,_bool>_>,_slang::hash<std::tuple<std::basic_string_view<char>,_const_slang::ast::Scope_*>_>,_std::equal_to<std::tuple<std::basic_string_view<char>,_const_slang::ast::Scope_*>_>,_std::allocator<std::pair<const_std::tuple<std::basic_string_view<char>,_const_slang::ast::Scope_*>,_std::pair<std::vector<slang::ast::Symbol_*>,_bool>_>_>_>
              .arrays.groups_size_mask;
      lVar32 = uVar30 + uVar31;
      uVar31 = uVar31 + 1;
      uVar30 = lVar32 + 1U & uVar9;
    } while (uVar31 <= uVar9);
  }
  goto LAB_002e770a;
LAB_002e7a21:
  if (ppCVar28 == ppCVar10) goto LAB_002e7840;
  this_00 = *ppCVar28;
  pSVar26 = Symbol::getSourceLibrary(&this_00->super_Symbol);
  if (pSVar26 == pSVar25) {
    this_00->isUsed = true;
    if (this_00->resolved == false) {
      ConfigBlockSymbol::resolve(this_00);
    }
    if ((this_00->topCells)._M_extent._M_extent_value != 1) {
      SVar36 = slang::syntax::SyntaxNode::sourceRange
                         ((SyntaxNode *)&(this_00->super_Symbol).originatingSyntax[8].previewNode);
      pDVar27 = Scope::addDiag(scope,(DiagCode)0x1a000d,SVar36);
      Diagnostic::operator<<(pDVar27,(this_00->super_Symbol).name);
      SVar36 = slang::syntax::SyntaxNode::sourceRange((rule->syntax).ptr);
      Diagnostic::addNote(pDVar27,(DiagCode)0x40001,SVar36);
      goto LAB_002e78a5;
    }
    pTVar11 = (this_00->topCells)._M_ptr;
    if (rule->paramOverrides != (ParameterValueAssignmentSyntax *)0x0) {
      SVar36 = slang::syntax::SyntaxNode::sourceRange(&rule->paramOverrides->super_SyntaxNode);
      pDVar27 = Scope::addDiag(scope,(DiagCode)0x2000d,SVar36);
      Diagnostic::operator<<(pDVar27,(this_00->super_Symbol).name);
    }
    pCVar12 = pTVar11->rule;
    (__return_storage_ptr__->first).definition = &pTVar11->definition->super_Symbol;
    (__return_storage_ptr__->first).configRoot = this_00;
    (__return_storage_ptr__->first).configRule = pCVar12;
    goto LAB_002e7b00;
  }
  ppCVar28 = ppCVar28 + 1;
  goto LAB_002e7a21;
  while (ppSVar29 = ppSVar29 + 1, ppSVar29 != ppSVar13) {
LAB_002e7ace:
    this_01 = *ppSVar29;
    pSVar26 = Symbol::getSourceLibrary(this_01);
    if (pSVar26 == pSVar25) {
      (__return_storage_ptr__->first).definition = this_01;
      (__return_storage_ptr__->first).configRoot = (ConfigBlockSymbol *)0x0;
      (__return_storage_ptr__->first).configRule = rule;
      goto LAB_002e7b00;
    }
  }
LAB_002e770a:
  sv = &(rule->useCell).name;
  uVar24 = hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>::operator()
                     ((hash<std::basic_string_view<char,_std::char_traits<char>_>,_void> *)
                      &this->configBlocks,sv);
  uVar31 = uVar24 >> ((byte)(this->configBlocks).table_.
                            super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_std::vector<const_slang::ast::ConfigBlockSymbol_*>_>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_std::vector<const_slang::ast::ConfigBlockSymbol_*>_>_>_>
                            .arrays.groups_size_index & 0x3f);
  lVar32 = (uVar24 & 0xff) * 4;
  uVar16 = (&UNK_004a938c)[lVar32];
  uVar17 = (&UNK_004a938d)[lVar32];
  uVar18 = (&UNK_004a938e)[lVar32];
  bVar19 = (&UNK_004a938f)[lVar32];
  uVar30 = 0;
  do {
    pgVar4 = (this->configBlocks).table_.
             super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_std::vector<const_slang::ast::ConfigBlockSymbol_*>_>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_std::vector<const_slang::ast::ConfigBlockSymbol_*>_>_>_>
             .arrays.groups_;
    pgVar1 = pgVar4 + uVar31;
    bVar21 = pgVar1->m[0xf].n;
    auVar34[0] = -(pgVar1->m[0].n == uVar16);
    auVar34[1] = -(pgVar1->m[1].n == uVar17);
    auVar34[2] = -(pgVar1->m[2].n == uVar18);
    auVar34[3] = -(pgVar1->m[3].n == bVar19);
    auVar34[4] = -(pgVar1->m[4].n == uVar16);
    auVar34[5] = -(pgVar1->m[5].n == uVar17);
    auVar34[6] = -(pgVar1->m[6].n == uVar18);
    auVar34[7] = -(pgVar1->m[7].n == bVar19);
    auVar34[8] = -(pgVar1->m[8].n == uVar16);
    auVar34[9] = -(pgVar1->m[9].n == uVar17);
    auVar34[10] = -(pgVar1->m[10].n == uVar18);
    auVar34[0xb] = -(pgVar1->m[0xb].n == bVar19);
    auVar34[0xc] = -(pgVar1->m[0xc].n == uVar16);
    auVar34[0xd] = -(pgVar1->m[0xd].n == uVar17);
    auVar34[0xe] = -(pgVar1->m[0xe].n == uVar18);
    auVar34[0xf] = -(bVar21 == bVar19);
    uVar22 = (uint)(ushort)((ushort)(SUB161(auVar34 >> 7,0) & 1) |
                            (ushort)(SUB161(auVar34 >> 0xf,0) & 1) << 1 |
                            (ushort)(SUB161(auVar34 >> 0x17,0) & 1) << 2 |
                            (ushort)(SUB161(auVar34 >> 0x1f,0) & 1) << 3 |
                            (ushort)(SUB161(auVar34 >> 0x27,0) & 1) << 4 |
                            (ushort)(SUB161(auVar34 >> 0x2f,0) & 1) << 5 |
                            (ushort)(SUB161(auVar34 >> 0x37,0) & 1) << 6 |
                            (ushort)(SUB161(auVar34 >> 0x3f,0) & 1) << 7 |
                            (ushort)(SUB161(auVar34 >> 0x47,0) & 1) << 8 |
                            (ushort)(SUB161(auVar34 >> 0x4f,0) & 1) << 9 |
                            (ushort)(SUB161(auVar34 >> 0x57,0) & 1) << 10 |
                            (ushort)(SUB161(auVar34 >> 0x5f,0) & 1) << 0xb |
                            (ushort)(SUB161(auVar34 >> 0x67,0) & 1) << 0xc |
                            (ushort)(SUB161(auVar34 >> 0x6f,0) & 1) << 0xd |
                           (ushort)(SUB161(auVar34 >> 0x77,0) & 1) << 0xe);
    if (uVar22 != 0) {
      ppVar5 = (this->configBlocks).table_.
               super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_std::vector<const_slang::ast::ConfigBlockSymbol_*>_>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_std::vector<const_slang::ast::ConfigBlockSymbol_*>_>_>_>
               .arrays.elements_;
      do {
        uVar14 = 0;
        if (uVar22 != 0) {
          for (; (uVar22 >> uVar14 & 1) == 0; uVar14 = uVar14 + 1) {
          }
        }
        __y = ppVar5 + uVar31 * 0xf + (ulong)uVar14;
        bVar20 = std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>::operator()
                           ((equal_to<std::basic_string_view<char,_std::char_traits<char>_>_> *)
                            &this->configBlocks,sv,&__y->first);
        if (bVar20) {
          ppCVar28 = (__y->second).
                     super__Vector_base<const_slang::ast::ConfigBlockSymbol_*,_std::allocator<const_slang::ast::ConfigBlockSymbol_*>_>
                     ._M_impl.super__Vector_impl_data._M_start;
          ppCVar10 = (__y->second).
                     super__Vector_base<const_slang::ast::ConfigBlockSymbol_*,_std::allocator<const_slang::ast::ConfigBlockSymbol_*>_>
                     ._M_impl.super__Vector_impl_data._M_finish;
          goto LAB_002e7a21;
        }
        uVar22 = uVar22 - 1 & uVar22;
      } while (uVar22 != 0);
      bVar21 = pgVar4[uVar31].m[0xf].n;
    }
    if (((&boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>::
           is_not_overflowed(unsigned_long)::shift)[(uint)uVar24 & 7] & bVar21) == 0) break;
    uVar33 = (this->configBlocks).table_.
             super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_std::vector<const_slang::ast::ConfigBlockSymbol_*>_>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_std::vector<const_slang::ast::ConfigBlockSymbol_*>_>_>_>
             .arrays.groups_size_mask;
    lVar32 = uVar31 + uVar30;
    uVar30 = uVar30 + 1;
    uVar31 = lVar32 + 1U & uVar33;
  } while (uVar30 <= uVar33);
LAB_002e7840:
  resolveConfigRule();
LAB_002e7b00:
  __return_storage_ptr__->second = true;
  return __return_storage_ptr__;
}

Assistant:

std::pair<Compilation::DefinitionLookupResult, bool> Compilation::resolveConfigRule(
    const Scope& scope, const ConfigRule& rule) const {

    rule.isUsed = true;
    auto& id = rule.useCell;
    SLANG_ASSERT(!id.name.empty());

    // Figure out the target library.
    const SourceLibrary* overrideLib = defaultLibPtr;
    if (id.lib.empty()) {
        if (auto parentDef = scope.asSymbol().getDeclaringDefinition())
            overrideLib = &parentDef->sourceLibrary;
    }
    else {
        overrideLib = getSourceLibrary(id.lib);
        if (!overrideLib) {
            root->addDiag(diag::UnknownLibrary, id.sourceRange) << id.lib;
            return {{}, true};
        }
    }

    if (!id.targetConfig) {
        if (auto overrideDefIt = definitionMap.find({id.name, root.get()});
            overrideDefIt != definitionMap.end()) {
            // There are definitions with this name; find the one that
            // matches our target library.
            auto result = findDefByLib(overrideDefIt->second.first, *overrideLib);
            if (result)
                return {{result, nullptr, &rule}, true};
        }
    }

    // If we didn't find a target definition, try to look for a config.
    if (auto configIt = configBlocks.find(id.name); configIt != configBlocks.end()) {
        auto result = findDefByLib(configIt->second, *overrideLib);
        if (result) {
            result->isUsed = true;
            auto topCells = result->getTopCells();
            if (topCells.size() != 1) {
                auto syntax = result->getSyntax();
                SLANG_ASSERT(syntax);

                auto range = syntax->as<ConfigDeclarationSyntax>().topCells.sourceRange();
                auto& diag = scope.addDiag(diag::NestedConfigMultipleTops, range);
                diag << result->name;
                diag.addNote(diag::NoteConfigRule, rule.syntax->sourceRange());

                return {{}, true};
            }

            if (rule.paramOverrides) {
                scope.addDiag(diag::ConfigParamsIgnored, rule.paramOverrides->sourceRange())
                    << result->name;
            }

            return {{&topCells[0].definition, result, topCells[0].rule}, true};
        }
    }

    // Otherwise we have an error.
    errorMissingDef(id.name, *root, id.sourceRange, diag::UnknownModule);
    return {{}, true};
}